

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbios_mgmt.c
# Opt level: O2

int vbios_upload_pramin(int cnum,uint8_t *vbios,int length)

{
  void *pvVar1;
  int iVar2;
  undefined4 uVar3;
  char cVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  if ((nva_cards[cnum]->chipset).chipset < 4) {
    iVar2 = -6;
  }
  else {
    fprintf(_stderr,"Attempt to upload the vbios to card %i (nv%02x) using PRAMIN\n",
            (ulong)(uint)cnum);
    vbios[length - 1U] = '\0';
    cVar4 = '\0';
    for (uVar8 = 0; (uint)length != uVar8; uVar8 = uVar8 + 1) {
      cVar4 = cVar4 + vbios[uVar8];
    }
    vbios[length - 1U] = -cVar4;
    uVar8 = 0;
    uVar3 = 0;
    if (0x4f < (nva_cards[cnum]->chipset).card_type) {
      pvVar1 = nva_cards[cnum]->bar0;
      uVar5 = *(uint *)((long)pvVar1 + 0x619f04) & 0xffff00;
      uVar7 = uVar5 << 8;
      if (uVar5 == 0) {
        uVar7 = *(int *)((long)pvVar1 + 0x1700) * 0x10000 + 0xf0000;
      }
      uVar3 = *(undefined4 *)((long)pvVar1 + 0x1700);
      *(uint *)((long)pvVar1 + 0x1700) = uVar7 >> 0x10;
    }
    uVar5 = 0x10000;
    if (length < 0x10000) {
      uVar5 = length;
    }
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar8;
    }
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      *(uint8_t *)((long)nva_cards[cnum]->bar0 + uVar8 + 0x700000) = vbios[uVar8];
    }
    iVar2 = 1;
    if (0x4f < (nva_cards[cnum]->chipset).card_type) {
      *(undefined4 *)((long)nva_cards[cnum]->bar0 + 0x1700) = uVar3;
    }
  }
  return iVar2;
}

Assistant:

int vbios_upload_pramin(int cnum, uint8_t *vbios, int length)
{
	uint32_t old_bar0_pramin = 0;
	int i = 0;

	if (nva_cards[cnum]->chipset.chipset < 0x04) {
		return ECARD;
	}

	fprintf(stderr, "Attempt to upload the vbios to card %i (nv%02x) using PRAMIN\n",
			cnum, nva_cards[cnum]->chipset.chipset);

	/* Update the checksum */
	chksum(vbios, length);

	if (nva_cards[cnum]->chipset.card_type >= 0x50) {
		uint32_t vbios_vram = (nva_rd32(cnum, 0x619f04) & ~0xff) << 8;

		if (!vbios_vram)
			vbios_vram = (nva_rd32(cnum, 0x1700) << 16) + 0xf0000;

		old_bar0_pramin = nva_rd32(cnum, 0x1700);
		nva_wr32(cnum, 0x1700, vbios_vram >> 16);
	}

	length = length < NV_PROM_SIZE ? length : NV_PROM_SIZE;

	for (i = 0; i < length; i++)
		nva_wr8(cnum, NV_PRAMIN_OFFSET + i, vbios[i]);

	if (nva_cards[cnum]->chipset.card_type >= 0x50)
		nva_wr32(cnum, 0x1700, old_bar0_pramin);

	return EOK;
}